

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O3

uint Kit_DsdNonDsdSupports(Kit_DsdNtk_t *pNtk)

{
  ushort uVar1;
  ushort uVar2;
  Kit_DsdObj_t KVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  
  Kit_DsdGetSupports(pNtk);
  uVar1 = pNtk->nNodes;
  if (uVar1 == 0) {
    uVar4 = 0;
  }
  else {
    uVar6 = 0;
    uVar4 = 0;
    do {
      if (pNtk->pNodes[uVar6] == (Kit_DsdObj_t *)0x0) {
        return uVar4;
      }
      KVar3 = *pNtk->pNodes[uVar6];
      if (((uint)KVar3 & 0x1c0) == 0x140) {
        uVar5 = (uint)KVar3 & 0x3f;
        uVar2 = pNtk->nVars;
        if ((uint)uVar2 + (uint)uVar1 <= uVar5) {
          __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kit.h"
                        ,0x9c,"unsigned int Kit_DsdLitSupport(Kit_DsdNtk_t *, int)");
        }
        if (pNtk->pSupps == (uint *)0x0) {
          uVar5 = 0;
        }
        else if (uVar5 < uVar2) {
          uVar5 = 1 << ((byte)uVar5 & 0x1f);
        }
        else {
          uVar5 = pNtk->pSupps[(ulong)uVar5 - (ulong)uVar2];
        }
        uVar4 = uVar4 | uVar5;
      }
      uVar6 = uVar6 + 1;
    } while (uVar1 != uVar6);
  }
  return uVar4;
}

Assistant:

unsigned Kit_DsdNonDsdSupports( Kit_DsdNtk_t * pNtk )
{
    Kit_DsdObj_t * pObj;
    unsigned i, uSupport = 0;
//    ABC_FREE( pNtk->pSupps );
    Kit_DsdGetSupports( pNtk );
    Kit_DsdNtkForEachObj( pNtk, pObj, i )
    {
        if ( pObj->Type != KIT_DSD_PRIME )
            continue;
        uSupport |= Kit_DsdLitSupport( pNtk, Abc_Var2Lit(pObj->Id,0) );
    }
    return uSupport;
}